

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O3

void __thiscall jessilib::impl::parser_manager::parser_manager(parser_manager *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<jessilib::parser> local_48;
  string local_38;
  
  p_Var1 = &(this->m_registrations)._M_t._M_impl.super__Rb_tree_header;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x30) = 0;
  this->m_last_id = 0;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_registrations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_parsers)._M_h._M_buckets = &(this->m_parsers)._M_h._M_single_bucket;
  (this->m_parsers)._M_h._M_bucket_count = 1;
  (this->m_parsers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_parsers)._M_h._M_element_count = 0;
  (this->m_parsers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_parsers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_parsers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b3098;
  local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__parser_001b3170;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"json","");
  register_parser(this,&local_48,&local_38,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

parser_manager::parser_manager() {
	// Add library-provided default parsers; intentionally delayed until construction rather than self-registration for zero-cost static initialization when unused
	register_parser(std::make_shared<json_parser>(), "json", false);
}